

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  string *psVar5;
  ArtifactType artifact_00;
  char *pcVar6;
  _Alloc_hider __s;
  char *pcVar7;
  LinkClosure *pLVar8;
  long *plVar9;
  size_t sVar10;
  size_type *psVar11;
  ulong *puVar12;
  long lVar13;
  _Alloc_hider _Var14;
  bool bVar15;
  string fw_prefix;
  string ll;
  size_type __dnew_1;
  size_type __dnew;
  string local_170;
  string local_150;
  char *local_130;
  char *local_128;
  string *local_120;
  string *local_118;
  ArtifactType local_10c;
  string local_108;
  undefined2 *local_e8;
  undefined8 local_e0;
  undefined2 local_d8;
  undefined6 uStack_d6;
  char *local_c8;
  string local_c0;
  string *local_a0;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (MODULE_LIBRARY < this->Target->TargetTypeValue) {
    std::__cxx11::string::_M_replace
              ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x59946e);
    std::__cxx11::string::_M_assign((string *)outBase);
    std::__cxx11::string::_M_replace
              ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x59946e);
    return;
  }
  local_120 = config;
  local_118 = outBase;
  if (artifact == ImportLibraryArtifact) {
    pcVar3 = this->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_90._M_dataplus._M_p = (pointer)0x1b;
    local_70._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_90);
    local_70.field_2._M_allocated_capacity = (size_type)local_90._M_dataplus._M_p;
    builtin_strncpy(local_70._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
    local_70._M_string_length = (size_type)local_90._M_dataplus._M_p;
    local_70._M_dataplus._M_p[(long)local_90._M_dataplus._M_p] = '\0';
    pcVar6 = cmMakefile::GetDefinition(pcVar3,&local_70);
    bVar15 = pcVar6 == (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    bVar15 = false;
  }
  if (bVar15) {
    std::__cxx11::string::_M_replace
              ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x59946e);
    std::__cxx11::string::_M_replace
              ((ulong)local_118,0,(char *)local_118->_M_string_length,0x59946e);
    std::__cxx11::string::_M_replace
              ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x59946e);
    return;
  }
  TVar2 = this->Target->TargetTypeValue;
  local_10c = RuntimeBinaryArtifact;
  if ((TVar2 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_10c = artifact;
  }
  if (TVar2 == EXECUTABLE) {
    local_10c = artifact;
  }
  local_a0 = outSuffix;
  if (artifact == ImportLibraryArtifact) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90.field_2._M_allocated_capacity._0_5_ = 0x524f504d49;
    local_90.field_2._M_allocated_capacity._5_3_ = 0x505f54;
    local_90.field_2._8_5_ = 0x5849464552;
    local_90._M_string_length = 0xd;
    local_90.field_2._M_local_buf[0xd] = '\0';
    __s._M_p = GetProperty(this,&local_90);
    psVar5 = local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT35(local_90.field_2._M_allocated_capacity._5_3_,
                               local_90.field_2._M_allocated_capacity._0_5_) + 1);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_5_ = 0x524f504d49;
    local_50.field_2._M_allocated_capacity._5_3_ = 0x535f54;
    local_50.field_2._8_5_ = 0x5849464655;
    local_50._M_string_length = 0xd;
    local_50.field_2._M_local_buf[0xd] = '\0';
    local_130 = GetProperty(this,&local_50);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0.field_2._M_allocated_capacity._0_4_ = 0x46455250;
    local_c0.field_2._M_allocated_capacity._4_2_ = 0x5849;
    local_c0._M_string_length = 6;
    local_c0.field_2._M_local_buf[6] = '\0';
    __s._M_p = GetProperty(this,&local_c0);
    psVar5 = local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT17(local_c0.field_2._M_local_buf[7],
                               CONCAT16(local_c0.field_2._M_local_buf[6],
                                        CONCAT24(local_c0.field_2._M_allocated_capacity._4_2_,
                                                 local_c0.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    local_c0.field_2._M_allocated_capacity._0_4_ = 0x46465553;
    local_c0.field_2._M_allocated_capacity._4_2_ = 0x5849;
    local_c0._M_string_length = 6;
    local_c0.field_2._M_local_buf[6] = '\0';
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_130 = GetProperty(this,&local_c0);
  }
  if (artifact == ImportLibraryArtifact) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_003bcd33;
    lVar13 = CONCAT35(local_50.field_2._M_allocated_capacity._5_3_,
                      local_50.field_2._M_allocated_capacity._0_5_);
    _Var14._M_p = local_50._M_dataplus._M_p;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_003bcd33;
    lVar13 = CONCAT17(local_c0.field_2._M_local_buf[7],
                      CONCAT16(local_c0.field_2._M_local_buf[6],
                               CONCAT24(local_c0.field_2._M_allocated_capacity._4_2_,
                                        local_c0.field_2._M_allocated_capacity._0_4_)));
    _Var14._M_p = local_c0._M_dataplus._M_p;
  }
  operator_delete(_Var14._M_p,lVar13 + 1);
LAB_003bcd33:
  if (psVar5->_M_string_length == 0) {
    local_c8 = (char *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&local_108,psVar5);
    std::__cxx11::string::append((char *)&local_108);
    pcVar6 = GetProperty(this,&local_108);
    if (((pcVar6 == (char *)0x0) || (bVar15 = IsAppBundleOnApple(this), bVar15)) ||
       (bVar15 = IsFrameworkOnApple(this), bVar15)) {
      pcVar6 = (char *)0x0;
    }
    local_c8 = pcVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  artifact_00 = local_10c;
  pcVar7 = cmTarget::GetPrefixVariableInternal(this->Target,local_10c);
  local_128 = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
  pLVar8 = GetLinkClosure(this,local_120);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar4 = (pLVar8->LinkerLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar4,pcVar4 + (pLVar8->LinkerLanguage)._M_string_length);
  pcVar6 = local_128;
  local_98 = outPrefix;
  if (local_108._M_string_length != 0) {
    if ((local_130 == (char *)0x0) && (local_128 != (char *)0x0)) {
      if (*local_128 == '\0') {
        local_130 = (char *)0x0;
      }
      else {
        local_e8 = &local_d8;
        local_d8 = 0x5f;
        local_e0 = 1;
        strlen(local_128);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)pcVar6)
        ;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150.field_2._8_8_ = plVar9[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_150._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_150,(ulong)local_108._M_dataplus._M_p);
        puVar12 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_170.field_2._M_allocated_capacity = *puVar12;
          local_170.field_2._8_8_ = plVar9[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = *puVar12;
          local_170._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_170._M_string_length = plVar9[1];
        *plVar9 = (long)puVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,CONCAT62(uStack_d6,local_d8) + 1);
        }
        local_130 = cmMakefile::GetDefinition(this->Makefile,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)__s._M_p ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) && (pcVar7 != (char *)0x0)) {
      if (*pcVar7 == '\0') {
        __s._M_p = (pointer)0x0;
      }
      else {
        local_d8 = 0x5f;
        local_e0 = 1;
        local_e8 = &local_d8;
        strlen(pcVar7);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)pcVar7)
        ;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150.field_2._8_8_ = plVar9[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_150._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_150,(ulong)local_108._M_dataplus._M_p);
        puVar12 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_170.field_2._M_allocated_capacity = *puVar12;
          local_170.field_2._8_8_ = plVar9[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = *puVar12;
          local_170._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_170._M_string_length = plVar9[1];
        *plVar9 = (long)puVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,CONCAT62(uStack_d6,local_d8) + 1);
        }
        __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if ((pcVar7 != (char *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    pcVar3 = this->Makefile;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    sVar10 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,pcVar7,pcVar7 + sVar10);
    __s._M_p = cmMakefile::GetSafeDefinition(pcVar3,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar6 = local_128;
  if ((local_128 != (char *)0x0) && (local_130 == (char *)0x0)) {
    pcVar3 = this->Makefile;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    sVar10 = strlen(local_128);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,pcVar6,pcVar6 + sVar10);
    local_130 = cmMakefile::GetSafeDefinition(pcVar3,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_allocated_capacity =
       local_170.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar15 = IsFrameworkOnApple(this);
  psVar5 = local_98;
  if (bVar15) {
    GetFrameworkDirectory(&local_150,this,local_120,ContentLevel);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_170);
    local_130 = (char *)0x0;
    __s._M_p = local_170._M_dataplus._M_p;
  }
  bVar15 = IsCFBundleOnApple(this);
  if (bVar15) {
    GetCFBundleDirectory(&local_150,this,local_120,FullLevel);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_170);
    local_130 = (char *)0x0;
    __s._M_p = local_170._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __s._M_p = "";
  }
  pcVar6 = (char *)psVar5->_M_string_length;
  strlen(__s._M_p);
  std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar6,(ulong)__s._M_p);
  GetOutputName(&local_150,this,local_120,local_10c);
  std::__cxx11::string::_M_append((char *)local_118,(ulong)local_150._M_dataplus._M_p);
  paVar1 = &local_150.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_118);
  local_150.field_2._M_allocated_capacity = 0x4f49535245564f53;
  local_150.field_2._8_2_ = 0x4e;
  local_150._M_string_length = 9;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = GetProperty(this,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    if (this->Target->TargetTypeValue == SHARED_LIBRARY && artifact != ImportLibraryArtifact) {
      pcVar3 = this->Makefile;
      local_e8 = (undefined2 *)0x26;
      local_150._M_dataplus._M_p = (pointer)paVar1;
      local_150._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_e8);
      local_150.field_2._M_allocated_capacity = (size_type)local_e8;
      *(undefined8 *)((long)local_150._M_dataplus._M_p + 0x10) = 0x4d414e5f59524152;
      *(undefined8 *)((long)local_150._M_dataplus._M_p + 0x18) = 0x565f485449575f45;
      *(undefined8 *)local_150._M_dataplus._M_p = 0x48535f454b414d43;
      *(undefined8 *)((long)local_150._M_dataplus._M_p + 8) = 0x42494c5f44455241;
      builtin_strncpy((char *)((long)local_150._M_dataplus._M_p + 0x1e),"_VERSION",8);
      local_150._M_string_length = (size_type)local_e8;
      local_150._M_dataplus._M_p[(long)local_e8] = '\0';
      bVar15 = cmMakefile::IsOn(pcVar3,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar15 = false;
    }
    if (bVar15 != false) {
      std::__cxx11::string::append((char *)local_118);
      std::__cxx11::string::append((char *)local_118);
    }
  }
  psVar5 = local_a0;
  pcVar6 = "";
  if (local_130 != (char *)0x0) {
    pcVar6 = local_130;
  }
  pcVar7 = (char *)local_a0->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar7,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));
  const char* configPostfix = CM_NULLPTR;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (configPostfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      configPostfix = CM_NULLPTR;
    }
  }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    if (!targetSuffix && suffixVar && *suffixVar) {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
    }
    if (!targetPrefix && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }
  }

  // if there is no prefix on the target use the cmake definition
  if (!targetPrefix && prefixVar) {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
  }
  // if there is no suffix on the target use the cmake definition
  if (!targetSuffix && suffixVar) {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
  }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = CM_NULLPTR;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = CM_NULLPTR;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix ? configPostfix : "";

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}